

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall FIX::TagOutOfOrder::TagOutOfOrder(TagOutOfOrder *this,int field,string *what)

{
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *what_local;
  TagOutOfOrder *pTStack_10;
  int field_local;
  TagOutOfOrder *this_local;
  
  local_20 = what;
  what_local._4_4_ = field;
  pTStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Tag specified out of required order",&local_41);
  Exception::Exception(&this->super_Exception,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  *(undefined ***)&this->super_Exception = &PTR__TagOutOfOrder_0032f630;
  this->field = what_local._4_4_;
  return;
}

Assistant:

TagOutOfOrder(int field = 0, const std::string &what = "")
      : Exception("Tag specified out of required order", what),
        field(field) {}